

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.h
# Opt level: O2

bool __thiscall
spvtools::opt::DominatorTree::Visit
          (DominatorTree *this,function<bool_(const_spvtools::opt::DominatorTreeNode_*)> *func)

{
  NodePtr pDVar1;
  NodePtr pDVar2;
  bool bVar3;
  const_iterator __begin2;
  DominatorTreeNode n;
  const_iterator __end2;
  const_iterator local_110;
  DominatorTreeNode local_b8;
  TreeDFIterator<const_spvtools::opt::DominatorTreeNode> local_88;
  
  cbegin(&local_110,this);
  TreeDFIterator<const_spvtools::opt::DominatorTreeNode>::TreeDFIterator(&local_88);
  while( true ) {
    pDVar2 = local_88.current_;
    pDVar1 = local_110.current_;
    if (local_110.current_ == local_88.current_) break;
    DominatorTreeNode::DominatorTreeNode(&local_b8,local_110.current_);
    bVar3 = std::function<bool_(const_spvtools::opt::DominatorTreeNode_*)>::operator()
                      (func,&local_b8);
    std::
    _Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ::~_Vector_base(&local_b8.children_.
                     super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                   );
    if (!bVar3) break;
    TreeDFIterator<const_spvtools::opt::DominatorTreeNode>::MoveToNextNode(&local_110);
  }
  std::
  _Deque_base<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                  *)&local_88.parent_iterators_);
  std::
  _Deque_base<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                  *)&local_110.parent_iterators_);
  return pDVar1 == pDVar2;
}

Assistant:

bool Visit(std::function<bool(const DominatorTreeNode*)> func) const {
    for (auto n : *this) {
      if (!func(&n)) return false;
    }
    return true;
  }